

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O0

uint __thiscall
cmELFInternalImpl<cmELFTypes32>::GetDynamicEntryCount(cmELFInternalImpl<cmELFTypes32> *this)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  uint local_1c;
  uint i;
  cmELFInternalImpl<cmELFTypes32> *this_local;
  
  bVar1 = LoadDynamicSection(this);
  if (bVar1) {
    for (local_1c = 0;
        sVar2 = std::vector<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>::size
                          (&this->DynamicSectionEntries), local_1c < sVar2; local_1c = local_1c + 1)
    {
      pvVar3 = std::vector<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>::operator[]
                         (&this->DynamicSectionEntries,(ulong)local_1c);
      if (pvVar3->d_tag == 0) {
        return local_1c;
      }
    }
    sVar2 = std::vector<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>::size(&this->DynamicSectionEntries);
    this_local._4_4_ = (uint)sVar2;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

unsigned int cmELFInternalImpl<Types>::GetDynamicEntryCount()
{
  if(!this->LoadDynamicSection())
    {
    return 0;
    }
  for(unsigned int i = 0; i < this->DynamicSectionEntries.size(); ++i)
    {
    if(this->DynamicSectionEntries[i].d_tag == DT_NULL)
      {
      return i;
      }
    }
  return static_cast<unsigned int>(this->DynamicSectionEntries.size());
}